

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O1

char * getSelectionString(Atom selection)

{
  long lVar1;
  Atom AVar2;
  int iVar3;
  Window WVar4;
  char *pcVar5;
  char *pcVar6;
  size_t __size;
  long lVar7;
  char *data;
  unsigned_long itemCount;
  long local_1f8;
  int actualFormat;
  long local_1e8;
  Atom actualType;
  Atom targets [2];
  unsigned_long bytesAfter;
  XEvent notification;
  XEvent dummy;
  
  targets[0] = _glfw.x11.UTF8_STRING;
  targets[1] = 0x1f;
  lVar1 = (ulong)(_glfw.x11.PRIMARY != selection) * 8;
  lVar7 = lVar1 + 0x1ff00;
  WVar4 = XGetSelectionOwner(_glfw.x11.display);
  if (WVar4 != _glfw.x11.helperWindowHandle) {
    free(*(void **)(_glfw.x11.keyName + lVar1 + -0x10));
    *(undefined8 *)(_glfw.x11.keyName + lVar1 + -0x10) = 0;
    local_1f8 = 0;
    local_1e8 = lVar7;
    do {
      AVar2 = targets[local_1f8];
      XConvertSelection(_glfw.x11.display,selection,AVar2,_glfw.x11.GLFW_SELECTION,
                        _glfw.x11.helperWindowHandle,0);
      while (iVar3 = XCheckTypedWindowEvent
                               (_glfw.x11.display,_glfw.x11.helperWindowHandle,0x1f,&notification),
            iVar3 == 0) {
        waitForEvent((double *)0x0);
      }
      if (notification.xkey.time != 0) {
        XCheckIfEvent(_glfw.x11.display,&dummy,isSelPropNewValueNotify,&notification);
        XGetWindowProperty(_glfw.x11.display,notification.xany.window,notification.xkey.time,0,
                           0x7fffffffffffffff,1,0,&actualType,&actualFormat,&itemCount,&bytesAfter,
                           &data);
        if (actualType == _glfw.x11.INCR) {
          __size = 1;
          pcVar5 = (char *)0x0;
          do {
            while (iVar3 = XCheckIfEvent(_glfw.x11.display,&dummy,isSelPropNewValueNotify,
                                         &notification), iVar3 == 0) {
              waitForEvent((double *)0x0);
            }
            XFree(data);
            XGetWindowProperty(_glfw.x11.display,notification.xany.window,notification.xkey.time,0,
                               0x7fffffffffffffff,1,0,&actualType,&actualFormat,&itemCount,
                               &bytesAfter,&data);
            if (itemCount != 0) {
              __size = __size + itemCount;
              pcVar5 = (char *)realloc(pcVar5,__size);
              pcVar5[~itemCount + __size] = '\0';
              strcat(pcVar5,data);
            }
          } while (itemCount != 0);
          if (targets[local_1f8] == 0x1f) {
            pcVar6 = convertLatin1toUTF8(pcVar5);
            lVar7 = local_1e8;
            *(char **)((long)&_glfw.initialized + local_1e8) = pcVar6;
            free(pcVar5);
          }
          else {
            *(char **)((long)&_glfw.initialized + local_1e8) = pcVar5;
            lVar7 = local_1e8;
          }
        }
        else if (actualType == AVar2) {
          if (AVar2 == 0x1f) {
            pcVar5 = convertLatin1toUTF8(data);
          }
          else {
            pcVar5 = _glfw_strdup(data);
          }
          *(char **)((long)&_glfw.initialized + lVar7) = pcVar5;
        }
        XFree(data);
        if (*(long *)((long)&_glfw.initialized + lVar7) != 0) goto LAB_0013dd4d;
      }
      if (local_1f8 != 0) goto LAB_0013dd4d;
      local_1f8 = 1;
    } while( true );
  }
LAB_0013dd67:
  return *(char **)((long)&_glfw.initialized + lVar7);
LAB_0013dd4d:
  if (*(long *)((long)&_glfw.initialized + lVar7) == 0) {
    _glfwInputError(0x10009,"X11: Failed to convert selection to string");
  }
  goto LAB_0013dd67;
}

Assistant:

static const char* getSelectionString(Atom selection)
{
    size_t i;
    char** selectionString = NULL;
    const Atom targets[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const size_t targetCount = sizeof(targets) / sizeof(targets[0]);

    if (selection == _glfw.x11.PRIMARY)
        selectionString = &_glfw.x11.primarySelectionString;
    else
        selectionString = &_glfw.x11.clipboardString;

    if (XGetSelectionOwner(_glfw.x11.display, selection) ==
        _glfw.x11.helperWindowHandle)
    {
        // Instead of doing a large number of X round-trips just to put this
        // string into a window property and then read it back, just return it
        return *selectionString;
    }

    free(*selectionString);
    *selectionString = NULL;

    for (i = 0;  i < targetCount;  i++)
    {
        char* data;
        Atom actualType;
        int actualFormat;
        unsigned long itemCount, bytesAfter;
        XEvent notification, dummy;

        XConvertSelection(_glfw.x11.display,
                          selection,
                          targets[i],
                          _glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,
                          CurrentTime);

        while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                       _glfw.x11.helperWindowHandle,
                                       SelectionNotify,
                                       &notification))
        {
            waitForEvent(NULL);
        }

        if (notification.xselection.property == None)
            continue;

        XCheckIfEvent(_glfw.x11.display,
                      &dummy,
                      isSelPropNewValueNotify,
                      (XPointer) &notification);

        XGetWindowProperty(_glfw.x11.display,
                           notification.xselection.requestor,
                           notification.xselection.property,
                           0,
                           LONG_MAX,
                           True,
                           AnyPropertyType,
                           &actualType,
                           &actualFormat,
                           &itemCount,
                           &bytesAfter,
                           (unsigned char**) &data);

        if (actualType == _glfw.x11.INCR)
        {
            size_t size = 1;
            char* string = NULL;

            for (;;)
            {
                while (!XCheckIfEvent(_glfw.x11.display,
                                      &dummy,
                                      isSelPropNewValueNotify,
                                      (XPointer) &notification))
                {
                    waitForEvent(NULL);
                }

                XFree(data);
                XGetWindowProperty(_glfw.x11.display,
                                   notification.xselection.requestor,
                                   notification.xselection.property,
                                   0,
                                   LONG_MAX,
                                   True,
                                   AnyPropertyType,
                                   &actualType,
                                   &actualFormat,
                                   &itemCount,
                                   &bytesAfter,
                                   (unsigned char**) &data);

                if (itemCount)
                {
                    size += itemCount;
                    string = realloc(string, size);
                    string[size - itemCount - 1] = '\0';
                    strcat(string, data);
                }

                if (!itemCount)
                {
                    if (targets[i] == XA_STRING)
                    {
                        *selectionString = convertLatin1toUTF8(string);
                        free(string);
                    }
                    else
                        *selectionString = string;

                    break;
                }
            }
        }
        else if (actualType == targets[i])
        {
            if (targets[i] == XA_STRING)
                *selectionString = convertLatin1toUTF8(data);
            else
                *selectionString = _glfw_strdup(data);
        }

        XFree(data);

        if (*selectionString)
            break;
    }

    if (!*selectionString)
    {
        _glfwInputError(GLFW_FORMAT_UNAVAILABLE,
                        "X11: Failed to convert selection to string");
    }

    return *selectionString;
}